

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cxx::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,FieldDescriptor *field)

{
  byte bVar1;
  long *plVar2;
  FieldDescriptor *pFVar3;
  int i_00;
  int i;
  ulong uVar4;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  plVar2 = *(long **)this;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    if ((ulong)plVar2[1] <= uVar4) {
      std::operator+(&local_90,"k",&local_70);
      std::operator+(__return_storage_ptr__,&local_90,"FieldNumber");
      std::__cxx11::string::~string((string *)&local_90);
      if ((this[0x34] == (cxx)0x0) &&
         (pFVar3 = Descriptor::FindFieldByCamelcaseName
                             (*(Descriptor **)(this + 0x38),*(string **)(this + 0x18)),
         pFVar3 != (FieldDescriptor *)this)) {
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(this + 0x28),i_00);
        std::operator+(&local_90,"_",&local_50);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&local_70);
      return __return_storage_ptr__;
    }
    bVar1 = *(byte *)(*plVar2 + uVar4);
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((byte)(bVar1 - 0x30) < 10) {
          std::__cxx11::string::push_back((char)&local_70);
        }
      }
      else if (bVar1 < 0x5b) goto LAB_001d16bb;
    }
    else if (bVar1 < 0x7b) {
LAB_001d16bb:
      std::__cxx11::string::push_back((char)&local_70);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string field_name = UnderscoresToCamelCase(field->name(), true);
  string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
        field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + SimpleItoa(field->number());
  }

  return result;
}